

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::add_extension(torrent *this,shared_ptr<libtorrent::torrent_plugin> *ext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  vector<peer_connection_*> *this_01;
  reference pppVar2;
  element_type *peVar3;
  shared_ptr<libtorrent::peer_plugin> local_98 [2];
  undefined1 local_78 [48];
  undefined1 local_48 [8];
  shared_ptr<libtorrent::peer_plugin> pp;
  peer_connection *p;
  iterator __end2;
  iterator __begin2;
  vector<peer_connection_*> *__range2;
  shared_ptr<libtorrent::torrent_plugin> *ext_local;
  torrent *this_local;
  
  ::std::__cxx11::
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ::push_back(&this->m_extensions,ext);
  this_01 = &(this->super_torrent_hot_members).m_connections;
  __end2 = ::std::
           vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ::begin(&this_01->
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  );
  p = (peer_connection *)
      ::std::
      vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::end(&this_01->
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                     *)&p), bVar1) {
    pppVar2 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2);
    pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pppVar2;
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ext);
    peer_connection::self((peer_connection *)local_78);
    ::std::weak_ptr<libtorrent::aux::peer_connection>::
    weak_ptr<libtorrent::aux::peer_connection,void>
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_78 + 0x10),
               (shared_ptr<libtorrent::aux::peer_connection> *)local_78);
    peer_connection_handle::peer_connection_handle
              ((peer_connection_handle *)(local_78 + 0x20),
               (weak_ptr<libtorrent::aux::peer_connection> *)(local_78 + 0x10));
    (*peVar3->_vptr_torrent_plugin[2])(local_48,peVar3,local_78 + 0x20);
    peer_connection_handle::~peer_connection_handle((peer_connection_handle *)(local_78 + 0x20));
    ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_78 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_78);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    this_00 = pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    if (bVar1) {
      ::std::shared_ptr<libtorrent::peer_plugin>::shared_ptr
                (local_98,(shared_ptr<libtorrent::peer_plugin> *)local_48);
      peer_connection::add_extension((peer_connection *)this_00._M_pi,local_98);
      ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr(local_98);
    }
    ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::peer_plugin> *)local_48);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2);
  }
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x19 & 1) != 0) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ext);
    (*peVar3->_vptr_torrent_plugin[8])();
  }
  return;
}

Assistant:

void torrent::add_extension(std::shared_ptr<torrent_plugin> ext)
	{
		m_extensions.push_back(ext);

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			std::shared_ptr<peer_plugin> pp(ext->new_connection(peer_connection_handle(p->self())));
			if (pp) p->add_extension(std::move(pp));
		}

		// if files are checked for this torrent, call the extension
		// to let it initialize itself
		if (m_connections_initialized)
			ext->on_files_checked();
	}